

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O2

IDeckLinkVideoOutputCallback *
cdecklink_internal_callback_create_deck_link_video_output_callback
          (void *ctx,cdecklink_video_output_callback_scheduled_frame_completed *cb0,
          cdecklink_video_output_callback_scheduled_playback_has_stopped *cb1)

{
  IDeckLinkVideoOutputCallback *pIVar1;
  
  if (cb0 != (cdecklink_video_output_callback_scheduled_frame_completed *)0x0 ||
      cb1 != (cdecklink_video_output_callback_scheduled_playback_has_stopped *)0x0) {
    pIVar1 = (IDeckLinkVideoOutputCallback *)operator_new(0x28);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108ab8;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    pIVar1[4].super_IUnknown._vptr_IUnknown = (_func_int **)cb1;
    return pIVar1;
  }
  return (IDeckLinkVideoOutputCallback *)0x0;
}

Assistant:

IDeckLinkVideoOutputCallback* cdecklink_internal_callback_create_deck_link_video_output_callback (void *ctx, cdecklink_video_output_callback_scheduled_frame_completed *cb0, cdecklink_video_output_callback_scheduled_playback_has_stopped *cb1) {
	if (cb0 != nullptr || cb1 != nullptr) {
		return new DeckLinkVideoOutputCallback(ctx, cb0, cb1);
	}
	return nullptr;
}